

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QGenericArrayOps<QMimeGlobPattern>::moveAppend
          (QGenericArrayOps<QMimeGlobPattern> *this,QMimeGlobPattern *b,QMimeGlobPattern *e)

{
  qsizetype *pqVar1;
  QMimeGlobPattern *pQVar2;
  long lVar3;
  Data *pDVar4;
  char16_t *pcVar5;
  qsizetype qVar6;
  CaseSensitivity CVar7;
  
  if ((b != e) && (b < e)) {
    pQVar2 = (this->super_QArrayDataPointer<QMimeGlobPattern>).ptr;
    do {
      lVar3 = (this->super_QArrayDataPointer<QMimeGlobPattern>).size;
      pDVar4 = (b->m_pattern).d.d;
      (b->m_pattern).d.d = (Data *)0x0;
      pQVar2[lVar3].m_pattern.d.d = pDVar4;
      pcVar5 = (b->m_pattern).d.ptr;
      (b->m_pattern).d.ptr = (char16_t *)0x0;
      pQVar2[lVar3].m_pattern.d.ptr = pcVar5;
      qVar6 = (b->m_pattern).d.size;
      (b->m_pattern).d.size = 0;
      pQVar2[lVar3].m_pattern.d.size = qVar6;
      pDVar4 = (b->m_mimeType).d.d;
      (b->m_mimeType).d.d = (Data *)0x0;
      pQVar2[lVar3].m_mimeType.d.d = pDVar4;
      pcVar5 = (b->m_mimeType).d.ptr;
      (b->m_mimeType).d.ptr = (char16_t *)0x0;
      pQVar2[lVar3].m_mimeType.d.ptr = pcVar5;
      qVar6 = (b->m_mimeType).d.size;
      (b->m_mimeType).d.size = 0;
      pQVar2[lVar3].m_mimeType.d.size = qVar6;
      CVar7 = b->m_caseSensitivity;
      pQVar2[lVar3].m_weight = b->m_weight;
      pQVar2[lVar3].m_caseSensitivity = CVar7;
      pQVar2[lVar3].m_patternType = b->m_patternType;
      b = b + 1;
      pqVar1 = &(this->super_QArrayDataPointer<QMimeGlobPattern>).size;
      *pqVar1 = *pqVar1 + 1;
    } while (b < e);
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }